

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

file_handle * __thiscall pstore::file::file_handle::path_abi_cxx11_(file_handle *this)

{
  long in_RSI;
  file_handle *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

std::string path () const override { return path_; }